

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_encodeSequences_bmi2
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong *puVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  ulong *puVar25;
  ulong local_a0;
  ulong local_98;
  
  if (dstCapacity < 9) {
    return 0xffffffffffffffba;
  }
  uVar2 = (ushort)*CTable_MatchLength;
  lVar5 = (long)(1 << (uVar2 - 1 & 0x1f));
  if (uVar2 == 0) {
    lVar5 = 1;
  }
  uVar8 = (ulong)mlCodeTable[nbSeq - 1];
  uVar15 = CTable_MatchLength[lVar5 + uVar8 * 2 + 2] + 0x8000;
  local_98 = (ulong)*(ushort *)
                     ((long)CTable_MatchLength +
                     (long)(int)CTable_MatchLength[lVar5 + uVar8 * 2 + 1] * 2 +
                     (ulong)((uVar15 & 0xffff0000) - CTable_MatchLength[lVar5 + uVar8 * 2 + 2] >>
                            ((ulong)(uVar15 >> 0x10) & 0x3f)) * 2 + 4);
  bVar1 = ofCodeTable[nbSeq - 1];
  uVar24 = (ulong)bVar1;
  uVar15 = (uint)bVar1;
  uVar3 = (ushort)*CTable_OffsetBits;
  lVar6 = (long)(1 << (uVar3 - 1 & 0x1f));
  if (uVar3 == 0) {
    lVar6 = 1;
  }
  uVar14 = CTable_OffsetBits[lVar6 + uVar24 * 2 + 2] + 0x8000;
  uVar4 = (ushort)*CTable_LitLength;
  lVar20 = (long)(1 << (uVar4 - 1 & 0x1f));
  if (uVar4 == 0) {
    lVar20 = 1;
  }
  uVar7 = (ulong)*(ushort *)
                  ((long)CTable_OffsetBits +
                  (long)(int)CTable_OffsetBits[lVar6 + uVar24 * 2 + 1] * 2 +
                  (ulong)((uVar14 & 0xffff0000) - CTable_OffsetBits[lVar6 + uVar24 * 2 + 2] >>
                         ((ulong)(uVar14 >> 0x10) & 0x3f)) * 2 + 4);
  uVar11 = (ulong)llCodeTable[nbSeq - 1];
  uVar23 = CTable_LitLength[lVar20 + uVar11 * 2 + 2] + 0x8000;
  uVar14 = LL_bits[uVar11];
  local_a0 = (ulong)*(ushort *)
                     ((long)CTable_LitLength +
                     (long)(int)CTable_LitLength[lVar20 + uVar11 * 2 + 1] * 2 +
                     (ulong)((uVar23 & 0xffff0000) - CTable_LitLength[lVar20 + uVar11 * 2 + 2] >>
                            ((ulong)(uVar23 >> 0x10) & 0x3f)) * 2 + 4);
  uVar11 = (ulong)((uint)sequences[nbSeq - 1].matchLength & BIT_mask[ML_bits[uVar8]]) <<
           ((ulong)uVar14 & 0x3f) | (ulong)((uint)sequences[nbSeq - 1].litLength & BIT_mask[uVar14])
  ;
  uVar14 = ML_bits[uVar8] + uVar14;
  uVar8 = (ulong)uVar14;
  puVar25 = (ulong *)((long)dst + (dstCapacity - 8));
  uVar23 = (uint)bVar1;
  puVar17 = (ulong *)dst;
  if (longOffsets == 0) {
    uVar11 = (ulong)(BIT_mask[uVar24] & sequences[nbSeq - 1].offset) << (uVar8 & 0x3f) | uVar11;
    uVar15 = uVar14 + uVar23;
    goto LAB_00182157;
  }
  if (bVar1 < 0x38) {
    uVar16 = sequences[nbSeq - 1].offset;
LAB_001820fc:
    uVar19 = 0;
  }
  else {
    uVar16 = sequences[nbSeq - 1].offset;
    if (uVar23 == 0x38) {
      uVar15 = 0x38;
      goto LAB_001820fc;
    }
    uVar19 = bVar1 - 0x38;
    uVar11 = (ulong)(BIT_mask[uVar19] & uVar16) << (uVar8 & 0x3f) | uVar11;
    uVar15 = (uVar23 + uVar14) - 0x38;
    *(ulong *)dst = uVar11;
    puVar17 = (ulong *)((ulong)(uVar15 >> 3) + (long)dst);
    if (puVar25 < puVar17) {
      puVar17 = puVar25;
    }
    uVar8 = (ulong)(uVar15 & 7);
    uVar11 = uVar11 >> ((ulong)((byte)uVar15 & 0xf8) & 0x3f);
    uVar15 = 0x38;
  }
  uVar11 = (ulong)(uVar16 >> (uVar19 & 0x1f) & BIT_mask[uVar15]) << (uVar8 & 0x3f) | uVar11;
  uVar15 = (int)uVar8 + uVar15;
LAB_00182157:
  *puVar17 = uVar11;
  puVar17 = (ulong *)((ulong)(uVar15 >> 3) + (long)puVar17);
  if (puVar25 < puVar17) {
    puVar17 = puVar25;
  }
  uVar11 = uVar11 >> ((ulong)((byte)uVar15 & 0xf8) & 0x3f);
  uVar15 = uVar15 & 7;
  if (1 < nbSeq) {
    uVar24 = nbSeq - 2;
    do {
      uVar12 = (ulong)llCodeTable[uVar24];
      bVar1 = ofCodeTable[uVar24];
      uVar13 = (ulong)bVar1;
      uVar22 = (ulong)mlCodeTable[uVar24];
      uVar21 = CTable_OffsetBits[lVar6 + uVar13 * 2 + 2] + uVar7 >> 0x10;
      uVar14 = (uint)uVar7;
      uVar16 = uVar15 + (int)(CTable_OffsetBits[lVar6 + uVar13 * 2 + 2] + uVar7 >> 0x10);
      uVar7 = (ulong)*(ushort *)
                      ((long)CTable_OffsetBits +
                      (long)(int)CTable_OffsetBits[lVar6 + uVar13 * 2 + 1] * 2 +
                      (uVar7 >> (uVar21 & 0x3f)) * 2 + 4);
      uVar18 = CTable_MatchLength[lVar5 + uVar22 * 2 + 2] + local_98 >> 0x10;
      uVar19 = (uint)local_98;
      uVar23 = (int)(CTable_MatchLength[lVar5 + uVar22 * 2 + 2] + local_98 >> 0x10) + uVar16;
      local_98 = (ulong)*(ushort *)
                         ((long)CTable_MatchLength +
                         (long)(int)CTable_MatchLength[lVar5 + uVar22 * 2 + 1] * 2 +
                         (local_98 >> (uVar18 & 0x3f)) * 2 + 4);
      uVar8 = CTable_LitLength[lVar20 + uVar12 * 2 + 2] + local_a0 >> 0x10;
      uVar11 = (ulong)(BIT_mask[uVar8] & (uint)local_a0) << ((ulong)uVar23 & 0x3f) |
               (ulong)(BIT_mask[uVar18] & uVar19) << ((ulong)uVar16 & 0x3f) |
               (ulong)(BIT_mask[uVar21] & uVar14) << uVar15 | uVar11;
      uVar23 = (int)(CTable_LitLength[lVar20 + uVar12 * 2 + 2] + local_a0 >> 0x10) + uVar23;
      uVar15 = LL_bits[uVar12];
      uVar14 = ML_bits[uVar22];
      local_a0 = (ulong)*(ushort *)
                         ((long)CTable_LitLength +
                         (long)(int)CTable_LitLength[lVar20 + uVar12 * 2 + 1] * 2 +
                         (local_a0 >> (uVar8 & 0x3f)) * 2 + 4);
      uVar16 = uVar14 + uVar15 + bVar1;
      if (0x1e < uVar16) {
        *puVar17 = uVar11;
        puVar9 = (ulong *)((ulong)(uVar23 >> 3) + (long)puVar17);
        puVar17 = puVar25;
        if (puVar9 <= puVar25) {
          puVar17 = puVar9;
        }
        uVar11 = uVar11 >> ((ulong)((byte)uVar23 & 0xf8) & 0x3f);
        uVar23 = uVar23 & 7;
      }
      uVar11 = (ulong)((uint)sequences[uVar24].matchLength & BIT_mask[uVar14]) <<
               ((ulong)(uVar15 + uVar23) & 0x3f) |
               (ulong)((uint)sequences[uVar24].litLength & BIT_mask[uVar15]) <<
               ((ulong)uVar23 & 0x3f) | uVar11;
      uVar14 = uVar14 + uVar15 + uVar23;
      uVar15 = uVar14;
      if (0x38 < uVar16) {
        *puVar17 = uVar11;
        puVar9 = (ulong *)((ulong)(uVar14 >> 3) + (long)puVar17);
        puVar17 = puVar25;
        if (puVar9 <= puVar25) {
          puVar17 = puVar9;
        }
        uVar15 = uVar14 & 7;
        uVar11 = uVar11 >> ((ulong)((byte)uVar14 & 0xf8) & 0x3f);
      }
      uVar8 = (ulong)uVar15;
      uVar14 = (uint)bVar1;
      if (longOffsets == 0) {
        uVar11 = (ulong)(BIT_mask[uVar13] & sequences[uVar24].offset) << (uVar8 & 0x3f) | uVar11;
        uVar15 = uVar15 + uVar14;
      }
      else {
        if (bVar1 < 0x38) {
          uVar23 = sequences[uVar24].offset;
          uVar16 = 0;
        }
        else {
          uVar16 = 0;
          uVar23 = sequences[uVar24].offset;
          uVar13 = 0x38;
          if (uVar14 != 0x38) {
            uVar16 = bVar1 - 0x38;
            uVar11 = (ulong)(BIT_mask[uVar16] & uVar23) << (uVar8 & 0x3f) | uVar11;
            uVar15 = (uVar14 + uVar15) - 0x38;
            *puVar17 = uVar11;
            puVar9 = (ulong *)((ulong)(uVar15 >> 3) + (long)puVar17);
            puVar17 = puVar25;
            if (puVar9 <= puVar25) {
              puVar17 = puVar9;
            }
            uVar8 = (ulong)(uVar15 & 7);
            uVar11 = uVar11 >> ((ulong)((byte)uVar15 & 0xf8) & 0x3f);
          }
        }
        uVar11 = (ulong)(uVar23 >> (uVar16 & 0x1f) & BIT_mask[uVar13]) << (uVar8 & 0x3f) | uVar11;
        uVar15 = (int)uVar8 + (int)uVar13;
      }
      *puVar17 = uVar11;
      puVar9 = (ulong *)((ulong)(uVar15 >> 3) + (long)puVar17);
      puVar17 = puVar25;
      if (puVar9 <= puVar25) {
        puVar17 = puVar9;
      }
      uVar11 = uVar11 >> ((ulong)((byte)uVar15 & 0xf8) & 0x3f);
      uVar24 = uVar24 - 1;
      uVar15 = uVar15 & 7;
    } while (uVar24 < nbSeq);
  }
  uVar11 = (ulong)((uint)local_98 & BIT_mask[uVar2]) << uVar15 | uVar11;
  uVar15 = uVar15 + uVar2;
  puVar9 = (ulong *)((ulong)(uVar15 >> 3) + (long)puVar17);
  if (puVar25 < puVar9) {
    puVar9 = puVar25;
  }
  *puVar17 = uVar11;
  uVar24 = (ulong)((uint)uVar7 & BIT_mask[uVar3]) << (uVar15 & 7) |
           uVar11 >> ((ulong)((byte)uVar15 & 0xf8) & 0x3f);
  uVar15 = (uVar15 & 7) + (uint)uVar3;
  *puVar9 = uVar24;
  puVar9 = (ulong *)((ulong)(uVar15 >> 3) + (long)puVar9);
  if (puVar25 < puVar9) {
    puVar9 = puVar25;
  }
  uVar24 = (ulong)((uint)local_a0 & BIT_mask[uVar4]) << (uVar15 & 7) |
           uVar24 >> ((ulong)((byte)uVar15 & 0xf8) & 0x3f);
  uVar15 = (uVar15 & 7) + (uint)uVar4;
  puVar17 = (ulong *)((ulong)(uVar15 >> 3) + (long)puVar9);
  if (puVar25 < puVar17) {
    puVar17 = puVar25;
  }
  *puVar9 = uVar24;
  uVar14 = (uVar15 & 7) + 1;
  *puVar17 = uVar24 >> ((ulong)((byte)uVar15 & 0xf8) & 0x3f) | 1L << (uVar15 & 7);
  puVar17 = (ulong *)((ulong)(uVar14 >> 3) + (long)puVar17);
  if (puVar25 < puVar17) {
    puVar17 = puVar25;
  }
  if ((puVar25 <= puVar17) ||
     (sVar10 = (long)puVar17 + ((ulong)((uVar14 & 7) != 0) - (long)dst), sVar10 == 0)) {
    sVar10 = 0xffffffffffffffba;
  }
  return sVar10;
}

Assistant:

size_t
ZSTD_encodeSequences_bmi2(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets)
{
    return ZSTD_encodeSequences_body(dst, dstCapacity,
                                    CTable_MatchLength, mlCodeTable,
                                    CTable_OffsetBits, ofCodeTable,
                                    CTable_LitLength, llCodeTable,
                                    sequences, nbSeq, longOffsets);
}